

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::PrintNestedMessages
          (Generator *this,Descriptor *containing_descriptor,string *prefix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *to_register)

{
  long lVar1;
  long lVar2;
  
  if (0 < *(int *)(containing_descriptor + 0x48)) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      io::Printer::Print(this->printer_,"\n");
      PrintMessage(this,(Descriptor *)(*(long *)(containing_descriptor + 0x50) + lVar2),prefix,
                   to_register);
      io::Printer::Print(this->printer_,",\n");
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0xa8;
    } while (lVar1 < *(int *)(containing_descriptor + 0x48));
  }
  return;
}

Assistant:

void Generator::PrintNestedMessages(const Descriptor& containing_descriptor,
                                    const string& prefix,
                                    std::vector<string>* to_register) const {
  for (int i = 0; i < containing_descriptor.nested_type_count(); ++i) {
    printer_->Print("\n");
    PrintMessage(*containing_descriptor.nested_type(i), prefix, to_register);
    printer_->Print(",\n");
  }
}